

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_endwithU_Test::TestBody(unitStrings_endwithU_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_410;
  Message local_408;
  allocator local_3f9;
  string local_3f8;
  precise_unit local_3d8;
  allocator local_3c1;
  string local_3c0;
  precise_unit local_3a0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_6;
  Message local_378;
  allocator local_369;
  string local_368;
  precise_unit local_348;
  allocator local_331;
  string local_330;
  precise_unit local_310;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_5;
  Message local_2e8;
  allocator local_2d9;
  string local_2d8;
  precise_unit local_2b8;
  allocator local_2a1;
  string local_2a0;
  precise_unit local_280;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  allocator local_249;
  string local_248;
  precise_unit local_228;
  allocator local_211;
  string local_210;
  precise_unit local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  Message local_1c8;
  allocator local_1b9;
  string local_1b8;
  precise_unit local_198;
  allocator local_181;
  string local_180;
  precise_unit local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  allocator local_129;
  string local_128;
  precise_unit local_108;
  allocator local_f1;
  string local_f0;
  precise_unit local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  allocator local_99;
  string local_98;
  precise_unit local_78 [2];
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_endwithU_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"astronomical unit",&local_51);
  uVar2 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_50,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"astronomicalu",&local_99);
  uVar2 = units::getDefaultFlags();
  local_78[0] = units::unit_from_string(&local_98,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"unit_from_string(\"astronomical unit\")",
             "unit_from_string(\"astronomicalu\")",&local_30,local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"arb. u.",&local_f1);
  uVar2 = units::getDefaultFlags();
  local_d0 = units::unit_from_string(&local_f0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"arbitraryunit",&local_129);
  uVar2 = units::getDefaultFlags();
  local_108 = units::unit_from_string(&local_128,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_c0,"unit_from_string(\"arb. u.\")",
             "unit_from_string(\"arbitraryunit\")",&local_d0,&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"arb. u.",&local_181);
  uVar2 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_180,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"arbitrary u.",&local_1b9);
  uVar2 = units::getDefaultFlags();
  local_198 = units::unit_from_string(&local_1b8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_150,"unit_from_string(\"arb. u.\")",
             "unit_from_string(\"arbitrary u.\")",&local_160,&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"arb.u.",&local_211);
  uVar2 = units::getDefaultFlags();
  local_1f0 = units::unit_from_string(&local_210,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"arbitrary u.",&local_249);
  uVar2 = units::getDefaultFlags();
  local_228 = units::unit_from_string(&local_248,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1e0,"unit_from_string(\"arb.u.\")",
             "unit_from_string(\"arbitrary u.\")",&local_1f0,&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"arb. unit",&local_2a1);
  uVar2 = units::getDefaultFlags();
  local_280 = units::unit_from_string(&local_2a0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"arbitrary u.",&local_2d9);
  uVar2 = units::getDefaultFlags();
  local_2b8 = units::unit_from_string(&local_2d8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_270,"unit_from_string(\"arb. unit\")",
             "unit_from_string(\"arbitrary u.\")",&local_280,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"p.d.u.",&local_331);
  uVar2 = units::getDefaultFlags();
  local_310 = units::unit_from_string(&local_330,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"arbitraryunit",&local_369);
  uVar2 = units::getDefaultFlags();
  local_348 = units::unit_from_string(&local_368,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_300,"unit_from_string(\"p.d.u.\")",
             "unit_from_string(\"arbitraryunit\")",&local_310,&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"arbitrary unit",&local_3c1);
  uVar2 = units::getDefaultFlags();
  local_3a0 = units::unit_from_string(&local_3c0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"arbitrary u.",&local_3f9);
  uVar2 = units::getDefaultFlags();
  local_3d8 = units::unit_from_string(&local_3f8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_390,"unit_from_string(\"arbitrary unit\")",
             "unit_from_string(\"arbitrary u.\")",&local_3a0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xf3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  return;
}

Assistant:

TEST(unitStrings, endwithU)
{
    EXPECT_EQ(
        unit_from_string("astronomical unit"),
        unit_from_string("astronomicalu"));
    EXPECT_EQ(unit_from_string("arb. u."), unit_from_string("arbitraryunit"));
    EXPECT_EQ(unit_from_string("arb. u."), unit_from_string("arbitrary u."));
    EXPECT_EQ(unit_from_string("arb.u."), unit_from_string("arbitrary u."));
    EXPECT_EQ(unit_from_string("arb. unit"), unit_from_string("arbitrary u."));
    EXPECT_EQ(unit_from_string("p.d.u."), unit_from_string("arbitraryunit"));
    EXPECT_EQ(
        unit_from_string("arbitrary unit"), unit_from_string("arbitrary u."));
}